

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiCommandBuffersTests.cpp
# Opt level: O1

TestStatus *
vkt::api::anon_unknown_0::renderPassContinueTest
          (TestStatus *__return_storage_ptr__,Context *context)

{
  VkImage obj;
  VkImageView obj_00;
  VkFramebuffer obj_01;
  TextureFormat TVar1;
  VkBuffer obj_02;
  long *plVar2;
  undefined8 uVar3;
  Allocator *pAVar4;
  VkCommandBuffer apVVar5 [1];
  TestStatus *pTVar6;
  VkResult VVar7;
  int iVar8;
  DeviceInterface *pDVar9;
  TextureLevel *this;
  byte *pbVar10;
  long lVar11;
  long lVar12;
  byte *pbVar13;
  ulong size;
  VkRenderPassCreateInfo renderPassCreateInfo;
  VkAttachmentDescription attachments [1];
  undefined4 uStack_294;
  VkCommandBuffer secondaryCommandBuffer;
  PixelBufferAccess pixelBufferAccess;
  VkAttachmentReference colorAttRef;
  Deleter<vk::Handle<(vk::HandleType)8>_> DStack_210;
  CommandBufferRenderPassTestEnvironment env;
  MovePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> result;
  undefined1 local_d8 [8];
  Deleter<vk::Handle<(vk::HandleType)17>_> DStack_d0;
  TestStatus *local_a8;
  TextureFormat tcuFormat;
  VkImageView attachmentViews [1];
  VkClearAttachment clearAttachment;
  VkClearRect clearRect;
  TextureFormat local_38;
  
  local_a8 = __return_storage_ptr__;
  pDVar9 = Context::getDeviceInterface(context);
  env.super_CommandBufferBareTestEnvironment<1U>.m_context = context;
  env.super_CommandBufferBareTestEnvironment<1U>.m_device = Context::getDevice(context);
  env.super_CommandBufferBareTestEnvironment<1U>.m_vkd = Context::getDeviceInterface(context);
  env.super_CommandBufferBareTestEnvironment<1U>.m_queue = Context::getUniversalQueue(context);
  env.super_CommandBufferBareTestEnvironment<1U>.m_queueFamilyIndex =
       Context::getUniversalQueueFamilyIndex(context);
  env.super_CommandBufferBareTestEnvironment<1U>.m_allocator = Context::getDefaultAllocator(context)
  ;
  env.super_CommandBufferBareTestEnvironment<1U>.m_commandPool.
  super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal = 0;
  env.super_CommandBufferBareTestEnvironment<1U>.m_commandPool.
  super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  env.super_CommandBufferBareTestEnvironment<1U>.m_commandPool.
  super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device = (VkDevice)0x0;
  env.super_CommandBufferBareTestEnvironment<1U>.m_commandPool.
  super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)&renderPassCreateInfo,
             env.super_CommandBufferBareTestEnvironment<1U>.m_vkd,
             env.super_CommandBufferBareTestEnvironment<1U>.m_device,2,
             env.super_CommandBufferBareTestEnvironment<1U>.m_queueFamilyIndex,
             (VkAllocationCallbacks *)0x0);
  pixelBufferAccess.super_ConstPixelBufferAccess.m_size.m_data[2] = renderPassCreateInfo.flags;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_pitch.m_data[0] =
       renderPassCreateInfo.attachmentCount;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_pitch.m_data[1] =
       (int)renderPassCreateInfo.pAttachments;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_pitch.m_data[2] =
       (int)((ulong)renderPassCreateInfo.pAttachments >> 0x20);
  pixelBufferAccess.super_ConstPixelBufferAccess.m_format.order = renderPassCreateInfo.sType;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_format.type = renderPassCreateInfo._4_4_;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_size.m_data._0_8_ = renderPassCreateInfo.pNext;
  renderPassCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  renderPassCreateInfo._4_4_ = 0;
  renderPassCreateInfo.pNext = (void *)0x0;
  renderPassCreateInfo.flags = 0;
  renderPassCreateInfo.attachmentCount = 0;
  renderPassCreateInfo.pAttachments = (VkAttachmentDescription *)0x0;
  if (env.super_CommandBufferBareTestEnvironment<1U>.m_commandPool.
      super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
              (&env.super_CommandBufferBareTestEnvironment<1U>.m_commandPool.
                super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter,
               (VkCommandPool)
               env.super_CommandBufferBareTestEnvironment<1U>.m_commandPool.
               super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal);
  }
  env.super_CommandBufferBareTestEnvironment<1U>.m_commandPool.
  super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)
       CONCAT44(pixelBufferAccess.super_ConstPixelBufferAccess.m_pitch.m_data[2],
                pixelBufferAccess.super_ConstPixelBufferAccess.m_pitch.m_data[1]);
  env.super_CommandBufferBareTestEnvironment<1U>.m_commandPool.
  super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device =
       (VkDevice)pixelBufferAccess.super_ConstPixelBufferAccess._16_8_;
  env.super_CommandBufferBareTestEnvironment<1U>.m_commandPool.
  super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal =
       (deUint64)pixelBufferAccess.super_ConstPixelBufferAccess.m_format;
  env.super_CommandBufferBareTestEnvironment<1U>.m_commandPool.
  super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)pixelBufferAccess.super_ConstPixelBufferAccess.m_size.m_data._0_8_;
  if (renderPassCreateInfo._0_8_ != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)24>_> *)&renderPassCreateInfo.pNext,
               (VkCommandPool)renderPassCreateInfo._0_8_);
  }
  pixelBufferAccess.super_ConstPixelBufferAccess.m_format.order = 0x28;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_size.m_data[0] = 0;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_size.m_data[1] = 0;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_size.m_data[2] =
       (undefined4)
       env.super_CommandBufferBareTestEnvironment<1U>.m_commandPool.
       super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_pitch.m_data[0] =
       env.super_CommandBufferBareTestEnvironment<1U>.m_commandPool.
       super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal._4_4_;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_pitch.m_data[1] = 0;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_pitch.m_data[2] = 1;
  VVar7 = (*(env.super_CommandBufferBareTestEnvironment<1U>.m_vkd)->_vptr_DeviceInterface[0x47])
                    (env.super_CommandBufferBareTestEnvironment<1U>.m_vkd,
                     env.super_CommandBufferBareTestEnvironment<1U>.m_device,
                     (VkSubpassDescription *)&pixelBufferAccess);
  ::vk::checkResult(VVar7,
                    "m_vkd.allocateCommandBuffers(m_device, &cmdBufferAllocateInfo, m_primaryCommandBuffers)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                    ,0x66);
  env.m_secondaryCommandBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object =
       (VkCommandBuffer_s *)0x0;
  env.m_secondaryCommandBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  env.m_secondaryCommandBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_device =
       (VkDevice)0x0;
  env.m_secondaryCommandBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.
  m_internal = 0;
  memset(&env.m_colorImage,0,0x88);
  renderPassCreateInfo.pAttachments = attachments;
  attachments[0].flags = 0;
  attachments[0].storeOp = VK_ATTACHMENT_STORE_OP_STORE;
  attachments[0].initialLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  attachments[0].format = VK_FORMAT_R8G8B8A8_UINT;
  attachments[0].samples = VK_SAMPLE_COUNT_1_BIT;
  attachments[0].loadOp = VK_ATTACHMENT_LOAD_OP_CLEAR;
  attachments[0].stencilLoadOp = VK_ATTACHMENT_LOAD_OP_DONT_CARE;
  attachments[0].stencilStoreOp = VK_ATTACHMENT_STORE_OP_DONT_CARE;
  stack0xfffffffffffffd68 = CONCAT44(uStack_294,2);
  pixelBufferAccess.super_ConstPixelBufferAccess.m_data = &colorAttRef;
  colorAttRef.attachment = 0;
  colorAttRef.layout = VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_size.m_data[2] = 0;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_pitch.m_data[0] = 0;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_pitch.m_data[2] = 0;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_format.order = R;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_format.type = SNORM_INT8;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_size.m_data[0] = 0;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_size.m_data[1] = 0;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_pitch.m_data[1] = 1;
  renderPassCreateInfo.sType = VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO;
  renderPassCreateInfo.pNext = (void *)0x0;
  renderPassCreateInfo.flags = 0;
  renderPassCreateInfo.attachmentCount = 1;
  renderPassCreateInfo.subpassCount = 1;
  renderPassCreateInfo._48_8_ = (ulong)(uint)renderPassCreateInfo._52_4_ << 0x20;
  renderPassCreateInfo.pDependencies = (VkSubpassDependency *)0x0;
  renderPassCreateInfo.pSubpasses = (VkSubpassDescription *)&pixelBufferAccess;
  ::vk::createRenderPass
            ((Move<vk::Handle<(vk::HandleType)17>_> *)local_d8,
             env.super_CommandBufferBareTestEnvironment<1U>.m_vkd,
             env.super_CommandBufferBareTestEnvironment<1U>.m_device,&renderPassCreateInfo,
             (VkAllocationCallbacks *)0x0);
  env.m_renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_allocator =
       DStack_d0.m_allocator;
  env.m_renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_device =
       DStack_d0.m_device;
  env.m_renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_deviceIface =
       DStack_d0.m_deviceIface;
  attachmentViews[0].m_internal = (VkImageView)(VkImageView)local_d8;
  local_d8._0_4_ = R;
  local_d8._4_4_ = SNORM_INT8;
  DStack_d0.m_deviceIface = (DeviceInterface *)0x0;
  DStack_d0.m_device = (VkDevice)0x0;
  DStack_d0.m_allocator = (VkAllocationCallbacks *)0x0;
  if (env.m_renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal != 0)
  {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)17>_>::operator()
              (&env.m_renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter,
               (VkRenderPass)
               env.m_renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.
               m_internal);
  }
  env.m_renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal =
       (deUint64)attachmentViews[0].m_internal;
  if ((TextureFormat)local_d8 != (TextureFormat)0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)17>_>::operator()
              (&DStack_d0,(VkRenderPass)local_d8);
  }
  pixelBufferAccess.super_ConstPixelBufferAccess.m_format.order = sRGB;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_size.m_data[0] = 0;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_size.m_data[1] = 0;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_size.m_data[2] = 0;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_pitch.m_data[0] = 1;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_pitch.m_data[1] = 0x29;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_pitch.m_data[2] = 0xff;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_data._0_4_ = 0xff;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_data._4_4_ = 1;
  ::vk::createImage((Move<vk::Handle<(vk::HandleType)9>_> *)attachments,
                    env.super_CommandBufferBareTestEnvironment<1U>.m_vkd,
                    env.super_CommandBufferBareTestEnvironment<1U>.m_device,
                    (VkImageCreateInfo *)&pixelBufferAccess,(VkAllocationCallbacks *)0x0);
  renderPassCreateInfo._4_4_ = attachments[0].format;
  renderPassCreateInfo.sType = attachments[0].flags;
  renderPassCreateInfo.pNext = (void *)CONCAT44(attachments[0].loadOp,attachments[0].samples);
  renderPassCreateInfo.attachmentCount = attachments[0].stencilLoadOp;
  renderPassCreateInfo.flags = attachments[0].storeOp;
  renderPassCreateInfo.pAttachments =
       (VkAttachmentDescription *)
       CONCAT44(attachments[0].initialLayout,attachments[0].stencilStoreOp);
  attachments[0].flags = 0;
  attachments[0].format = VK_FORMAT_UNDEFINED;
  attachments[0].samples = 0;
  attachments[0].loadOp = VK_ATTACHMENT_LOAD_OP_LOAD;
  attachments[0].storeOp = VK_ATTACHMENT_STORE_OP_STORE;
  attachments[0].stencilLoadOp = VK_ATTACHMENT_LOAD_OP_LOAD;
  attachments[0].stencilStoreOp = VK_ATTACHMENT_STORE_OP_STORE;
  attachments[0].initialLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  if (env.m_colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal != 0)
  {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
              (&env.m_colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter,
               (VkImage)env.m_colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object
                        .m_internal);
  }
  env.m_colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device =
       (VkDevice)renderPassCreateInfo._16_8_;
  env.m_colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)renderPassCreateInfo.pAttachments;
  env.m_colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal =
       renderPassCreateInfo._0_8_;
  env.m_colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)renderPassCreateInfo.pNext;
  obj.m_internal._4_4_ = attachments[0].format;
  obj.m_internal._0_4_ = attachments[0].flags;
  if (obj.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)9>_> *)&attachments[0].samples,obj);
  }
  pAVar4 = env.super_CommandBufferBareTestEnvironment<1U>.m_allocator;
  ::vk::getImageMemoryRequirements
            ((VkMemoryRequirements *)&pixelBufferAccess,
             env.super_CommandBufferBareTestEnvironment<1U>.m_vkd,
             env.super_CommandBufferBareTestEnvironment<1U>.m_device,
             (VkImage)env.m_colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                      m_internal);
  (*pAVar4->_vptr_Allocator[3])(&renderPassCreateInfo,pAVar4,&pixelBufferAccess,0);
  uVar3 = renderPassCreateInfo._0_8_;
  renderPassCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  renderPassCreateInfo._4_4_ = 0;
  if (env.m_colorImageMemory.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
      m_data.ptr != (Allocation *)uVar3) {
    if (env.m_colorImageMemory.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>
        .m_data.ptr != (Allocation *)0x0) {
      (*(env.m_colorImageMemory.
         super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
        _vptr_Allocation[1])();
    }
    env.m_colorImageMemory.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
    m_data.ptr = (Allocation *)uVar3;
  }
  if (renderPassCreateInfo._0_8_ != 0) {
    (**(code **)(*(long *)renderPassCreateInfo._0_8_ + 8))();
    renderPassCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    renderPassCreateInfo._4_4_ = 0;
  }
  VVar7 = (*(env.super_CommandBufferBareTestEnvironment<1U>.m_vkd)->_vptr_DeviceInterface[0xd])
                    (env.super_CommandBufferBareTestEnvironment<1U>.m_vkd,
                     env.super_CommandBufferBareTestEnvironment<1U>.m_device,
                     env.m_colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                     m_internal,
                     ((env.m_colorImageMemory.
                       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
                      ptr)->m_memory).m_internal);
  ::vk::checkResult(VVar7,
                    "m_vkd.bindImageMemory(m_device, *m_colorImage, m_colorImageMemory->getMemory(), m_colorImageMemory->getOffset())"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                    ,0xf0);
  pixelBufferAccess.super_ConstPixelBufferAccess.m_format.order = sRGBA;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_size.m_data[0] = 0;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_size.m_data[1] = 0;
  pixelBufferAccess.super_ConstPixelBufferAccess._16_8_ =
       pixelBufferAccess.super_ConstPixelBufferAccess._16_8_ & 0xffffffff00000000;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_pitch.m_data[1] =
       (int)env.m_colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_pitch.m_data[2] =
       (int)(env.m_colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal
            >> 0x20);
  pixelBufferAccess.super_ConstPixelBufferAccess.m_data._0_4_ = 1;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_data._4_4_ = 0x29;
  ::vk::createImageView
            ((Move<vk::Handle<(vk::HandleType)13>_> *)attachments,
             env.super_CommandBufferBareTestEnvironment<1U>.m_vkd,
             env.super_CommandBufferBareTestEnvironment<1U>.m_device,
             (VkImageViewCreateInfo *)&pixelBufferAccess,(VkAllocationCallbacks *)0x0);
  renderPassCreateInfo._4_4_ = attachments[0].format;
  renderPassCreateInfo.sType = attachments[0].flags;
  renderPassCreateInfo.pNext = (void *)CONCAT44(attachments[0].loadOp,attachments[0].samples);
  renderPassCreateInfo.attachmentCount = attachments[0].stencilLoadOp;
  renderPassCreateInfo.flags = attachments[0].storeOp;
  renderPassCreateInfo.pAttachments =
       (VkAttachmentDescription *)
       CONCAT44(attachments[0].initialLayout,attachments[0].stencilStoreOp);
  attachments[0].flags = 0;
  attachments[0].format = VK_FORMAT_UNDEFINED;
  attachments[0].samples = 0;
  attachments[0].loadOp = VK_ATTACHMENT_LOAD_OP_LOAD;
  attachments[0].storeOp = VK_ATTACHMENT_STORE_OP_STORE;
  attachments[0].stencilLoadOp = VK_ATTACHMENT_LOAD_OP_LOAD;
  attachments[0].stencilStoreOp = VK_ATTACHMENT_STORE_OP_STORE;
  attachments[0].initialLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  if (env.m_colorImageView.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal
      != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
              (&env.m_colorImageView.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter,
               (VkImageView)
               env.m_colorImageView.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.
               m_internal);
  }
  env.m_colorImageView.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device =
       (VkDevice)renderPassCreateInfo._16_8_;
  env.m_colorImageView.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)renderPassCreateInfo.pAttachments;
  env.m_colorImageView.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal =
       renderPassCreateInfo._0_8_;
  env.m_colorImageView.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)renderPassCreateInfo.pNext;
  obj_00.m_internal._4_4_ = attachments[0].format;
  obj_00.m_internal._0_4_ = attachments[0].flags;
  if (obj_00.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)13>_> *)&attachments[0].samples,obj_00);
  }
  attachmentViews[0].m_internal =
       (VkImageView)
       (VkImageView)
       env.m_colorImageView.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_format.order = 0x25;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_size.m_data[0] = 0;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_size.m_data[1] = 0;
  pixelBufferAccess.super_ConstPixelBufferAccess._16_8_ =
       pixelBufferAccess.super_ConstPixelBufferAccess._16_8_ & 0xffffffff00000000;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_pitch.m_data[1] =
       (int)env.m_renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal
  ;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_pitch.m_data[2] =
       (int)(env.m_renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.
             m_internal >> 0x20);
  pixelBufferAccess.super_ConstPixelBufferAccess.m_data._0_4_ = 1;
  ::vk::createFramebuffer
            ((Move<vk::Handle<(vk::HandleType)23>_> *)attachments,
             env.super_CommandBufferBareTestEnvironment<1U>.m_vkd,
             env.super_CommandBufferBareTestEnvironment<1U>.m_device,
             (VkFramebufferCreateInfo *)&pixelBufferAccess,(VkAllocationCallbacks *)0x0);
  renderPassCreateInfo._4_4_ = attachments[0].format;
  renderPassCreateInfo.sType = attachments[0].flags;
  renderPassCreateInfo.pNext = (void *)CONCAT44(attachments[0].loadOp,attachments[0].samples);
  renderPassCreateInfo.attachmentCount = attachments[0].stencilLoadOp;
  renderPassCreateInfo.flags = attachments[0].storeOp;
  renderPassCreateInfo.pAttachments =
       (VkAttachmentDescription *)
       CONCAT44(attachments[0].initialLayout,attachments[0].stencilStoreOp);
  attachments[0].flags = 0;
  attachments[0].format = VK_FORMAT_UNDEFINED;
  attachments[0].samples = 0;
  attachments[0].loadOp = VK_ATTACHMENT_LOAD_OP_LOAD;
  attachments[0].storeOp = VK_ATTACHMENT_STORE_OP_STORE;
  attachments[0].stencilLoadOp = VK_ATTACHMENT_LOAD_OP_LOAD;
  attachments[0].stencilStoreOp = VK_ATTACHMENT_STORE_OP_STORE;
  attachments[0].initialLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  if (env.m_frameBuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal != 0
     ) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()
              (&env.m_frameBuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter,
               (VkFramebuffer)
               env.m_frameBuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.
               m_internal);
  }
  env.m_frameBuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_device =
       (VkDevice)renderPassCreateInfo._16_8_;
  env.m_frameBuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)renderPassCreateInfo.pAttachments;
  env.m_frameBuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal =
       renderPassCreateInfo._0_8_;
  env.m_frameBuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)renderPassCreateInfo.pNext;
  obj_01.m_internal._4_4_ = attachments[0].format;
  obj_01.m_internal._0_4_ = attachments[0].flags;
  if (obj_01.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)23>_> *)&attachments[0].samples,obj_01);
  }
  renderPassCreateInfo.sType = VK_STRUCTURE_TYPE_COMMAND_BUFFER_ALLOCATE_INFO;
  renderPassCreateInfo.pNext = (void *)0x0;
  renderPassCreateInfo.flags =
       (undefined4)
       env.super_CommandBufferBareTestEnvironment<1U>.m_commandPool.
       super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal;
  renderPassCreateInfo.attachmentCount =
       env.super_CommandBufferBareTestEnvironment<1U>.m_commandPool.
       super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal._4_4_;
  renderPassCreateInfo.pAttachments = (VkAttachmentDescription *)0x100000001;
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)attachments,
             env.super_CommandBufferBareTestEnvironment<1U>.m_vkd,
             env.super_CommandBufferBareTestEnvironment<1U>.m_device,
             (VkCommandBufferAllocateInfo *)&renderPassCreateInfo);
  pixelBufferAccess.super_ConstPixelBufferAccess.m_format.type = attachments[0].format;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_format.order = attachments[0].flags;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_size.m_data[0] = attachments[0].samples;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_size.m_data[1] = attachments[0].loadOp;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_size.m_data[2] = attachments[0].storeOp;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_pitch.m_data[0] = attachments[0].stencilLoadOp;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_pitch.m_data[1] = attachments[0].stencilStoreOp;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_pitch.m_data[2] = attachments[0].initialLayout;
  attachments[0].flags = 0;
  attachments[0].format = VK_FORMAT_UNDEFINED;
  attachments[0].samples = 0;
  attachments[0].loadOp = VK_ATTACHMENT_LOAD_OP_LOAD;
  attachments[0].storeOp = VK_ATTACHMENT_STORE_OP_STORE;
  attachments[0].stencilLoadOp = VK_ATTACHMENT_LOAD_OP_LOAD;
  attachments[0].stencilStoreOp = VK_ATTACHMENT_STORE_OP_STORE;
  attachments[0].initialLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  if (env.m_secondaryCommandBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object !=
      (VkCommandBuffer_s *)0x0) {
    attachmentViews[0].m_internal =
         (VkImageView)
         (VkImageView)
         env.m_secondaryCommandBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object;
    (*(env.m_secondaryCommandBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.
      m_deviceIface)->_vptr_DeviceInterface[0x48])
              (env.m_secondaryCommandBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.
               m_deviceIface,
               env.m_secondaryCommandBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.
               m_device,env.m_secondaryCommandBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.
                        deleter.m_pool.m_internal,1);
  }
  env.m_secondaryCommandBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_device =
       (VkDevice)
       CONCAT44(pixelBufferAccess.super_ConstPixelBufferAccess.m_pitch.m_data[0],
                pixelBufferAccess.super_ConstPixelBufferAccess.m_size.m_data[2]);
  env.m_secondaryCommandBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.
  m_internal._4_4_ = pixelBufferAccess.super_ConstPixelBufferAccess.m_pitch.m_data[2];
  env.m_secondaryCommandBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.
  m_internal._0_4_ = pixelBufferAccess.super_ConstPixelBufferAccess.m_pitch.m_data[1];
  env.m_secondaryCommandBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object =
       (VkCommandBuffer_s *)pixelBufferAccess.super_ConstPixelBufferAccess.m_format;
  env.m_secondaryCommandBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)
       CONCAT44(pixelBufferAccess.super_ConstPixelBufferAccess.m_size.m_data[1],
                pixelBufferAccess.super_ConstPixelBufferAccess.m_size.m_data[0]);
  TVar1.type = attachments[0].format;
  TVar1.order = attachments[0].flags;
  if (TVar1 != (TextureFormat)0x0) {
    pixelBufferAccess.super_ConstPixelBufferAccess.m_format = TVar1;
    (**(code **)(*(long *)CONCAT44(attachments[0].loadOp,attachments[0].samples) + 0x240))
              ((long *)CONCAT44(attachments[0].loadOp,attachments[0].samples),
               CONCAT44(attachments[0].stencilLoadOp,attachments[0].storeOp),
               CONCAT44(attachments[0].initialLayout,attachments[0].stencilStoreOp),1);
  }
  apVVar5[0] = env.super_CommandBufferBareTestEnvironment<1U>.m_primaryCommandBuffers[0];
  secondaryCommandBuffer =
       env.m_secondaryCommandBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object;
  clearAttachment.aspectMask = 1;
  clearAttachment.colorAttachment = 0;
  clearAttachment.clearValue._0_4_ = 2.8026e-45;
  clearAttachment.clearValue._4_4_ = 0x2f;
  clearAttachment.clearValue._8_8_ = 0xd300000083;
  clearRect.rect.offset.x = 0;
  clearRect.rect.offset.y = 0;
  clearRect.rect.extent.width = 0xff;
  clearRect.rect.extent.height = 0xff;
  clearRect.baseArrayLayer = 0;
  clearRect.layerCount = 1;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_format.order = 0x29;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_size.m_data[0] = 0;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_size.m_data[1] = 0;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_size.m_data[2] =
       (undefined4)
       env.m_renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_pitch.m_data[0] =
       env.m_renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal.
       _4_4_;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_pitch.m_data[1] = 0;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_data._0_4_ =
       SUB84(env.m_frameBuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.
             m_internal,0);
  pixelBufferAccess.super_ConstPixelBufferAccess.m_data._4_4_ =
       SUB84(env.m_frameBuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.
             m_internal >> 0x20,0);
  renderPassCreateInfo.sType = VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO;
  renderPassCreateInfo.pNext = (void *)0x0;
  renderPassCreateInfo.flags = 2;
  renderPassCreateInfo.pAttachments = (VkAttachmentDescription *)&pixelBufferAccess;
  VVar7 = (*(env.super_CommandBufferBareTestEnvironment<1U>.m_vkd)->_vptr_DeviceInterface[0x49])
                    (env.super_CommandBufferBareTestEnvironment<1U>.m_vkd,
                     env.m_secondaryCommandBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.
                     object,&renderPassCreateInfo);
  ::vk::checkResult(VVar7,
                    "m_vkd.beginCommandBuffer(*m_secondaryCommandBuffer, &commandBufferBeginInfo)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                    ,0x16c);
  (*pDVar9->_vptr_DeviceInterface[0x68])
            (pDVar9,secondaryCommandBuffer,1,&clearAttachment,1,&clearRect);
  VVar7 = (*pDVar9->_vptr_DeviceInterface[0x4a])(pDVar9,secondaryCommandBuffer);
  ::vk::checkResult(VVar7,"vkd.endCommandBuffer(secondaryCommandBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                    ,0x872);
  pixelBufferAccess.super_ConstPixelBufferAccess.m_size.m_data[0] = 0;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_size.m_data[1] = 0;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_pitch.m_data[1] = 0;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_pitch.m_data[2] = 0;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_format.order = 0x2a;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_format.type = SNORM_INT8;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_size.m_data[2] = 0;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_pitch.m_data[0] = 0;
  VVar7 = (*(env.super_CommandBufferBareTestEnvironment<1U>.m_vkd)->_vptr_DeviceInterface[0x49])
                    (env.super_CommandBufferBareTestEnvironment<1U>.m_vkd,
                     env.super_CommandBufferBareTestEnvironment<1U>.m_primaryCommandBuffers[0]);
  ::vk::checkResult(VVar7,
                    "m_vkd.beginCommandBuffer(m_primaryCommandBuffers[0], &commandBufferBeginInfo)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                    ,0x151);
  renderPassCreateInfo.sType = VK_STRUCTURE_TYPE_PIPELINE_CACHE_CREATE_INFO;
  renderPassCreateInfo._4_4_ = 0x3b;
  renderPassCreateInfo.pNext = (void *)0xfb000000a3;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_format.order = 0x2b;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_size.m_data[0] = 0;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_size.m_data[1] = 0;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_size.m_data[2] =
       (undefined4)
       env.m_renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_pitch.m_data[0] =
       env.m_renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal.
       _4_4_;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_pitch.m_data[1] =
       (int)env.m_frameBuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.
            m_internal;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_pitch.m_data[2] =
       (int)(env.m_frameBuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.
             m_internal >> 0x20);
  pixelBufferAccess.super_ConstPixelBufferAccess.m_data._0_4_ = 0;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_data._4_4_ = 0;
  (*(env.super_CommandBufferBareTestEnvironment<1U>.m_vkd)->_vptr_DeviceInterface[0x74])
            (env.super_CommandBufferBareTestEnvironment<1U>.m_vkd,
             env.super_CommandBufferBareTestEnvironment<1U>.m_primaryCommandBuffers[0],
             &pixelBufferAccess,1);
  (*pDVar9->_vptr_DeviceInterface[0x77])(pDVar9,apVVar5[0],1,&secondaryCommandBuffer);
  (*pDVar9->_vptr_DeviceInterface[0x76])(pDVar9,apVVar5[0]);
  VVar7 = (*pDVar9->_vptr_DeviceInterface[0x4a])(pDVar9,apVVar5[0]);
  ::vk::checkResult(VVar7,"vkd.endCommandBuffer(primaryCommandBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                    ,0x87a);
  CommandBufferRenderPassTestEnvironment::submitPrimaryCommandBuffer(&env);
  DStack_210.m_device = (VkDevice)0x0;
  DStack_210.m_allocator = (VkAllocationCallbacks *)0x0;
  colorAttRef.attachment = 0;
  colorAttRef.layout = VK_IMAGE_LAYOUT_UNDEFINED;
  DStack_210.m_deviceIface = (DeviceInterface *)0x0;
  tcuFormat = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UINT);
  iVar8 = tcu::TextureFormat::getPixelSize(&tcuFormat);
  this = (TextureLevel *)operator_new(0x28);
  tcu::TextureLevel::TextureLevel(this,&tcuFormat,0xff,0xff,1);
  pixelBufferAccess.super_ConstPixelBufferAccess.m_pitch.m_data[1] = iVar8 * 0xfe01;
  size = (ulong)(uint)pixelBufferAccess.super_ConstPixelBufferAccess.m_pitch.m_data[1];
  pixelBufferAccess.super_ConstPixelBufferAccess.m_format.order = sR;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_size.m_data[0] = 0;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_size.m_data[1] = 0;
  pixelBufferAccess.super_ConstPixelBufferAccess._16_8_ =
       pixelBufferAccess.super_ConstPixelBufferAccess._16_8_ & 0xffffffff00000000;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_pitch.m_data[2] = 0;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_data._0_4_ = 2;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_data._4_4_ = 0;
  result.super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>.m_data.ptr =
       this;
  ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)attachments,
                     env.super_CommandBufferBareTestEnvironment<1U>.m_vkd,
                     env.super_CommandBufferBareTestEnvironment<1U>.m_device,
                     (VkBufferCreateInfo *)&pixelBufferAccess,(VkAllocationCallbacks *)0x0);
  renderPassCreateInfo._4_4_ = attachments[0].format;
  renderPassCreateInfo.sType = attachments[0].flags;
  renderPassCreateInfo.pNext = (void *)CONCAT44(attachments[0].loadOp,attachments[0].samples);
  renderPassCreateInfo.attachmentCount = attachments[0].stencilLoadOp;
  renderPassCreateInfo.flags = attachments[0].storeOp;
  renderPassCreateInfo.pAttachments =
       (VkAttachmentDescription *)
       CONCAT44(attachments[0].initialLayout,attachments[0].stencilStoreOp);
  attachments[0].flags = 0;
  attachments[0].format = VK_FORMAT_UNDEFINED;
  attachments[0].samples = 0;
  attachments[0].loadOp = VK_ATTACHMENT_LOAD_OP_LOAD;
  attachments[0].storeOp = VK_ATTACHMENT_STORE_OP_STORE;
  attachments[0].stencilLoadOp = VK_ATTACHMENT_LOAD_OP_LOAD;
  attachments[0].stencilStoreOp = VK_ATTACHMENT_STORE_OP_STORE;
  attachments[0].initialLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  if (colorAttRef != (VkAttachmentReference)0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&DStack_210,(VkBuffer)colorAttRef);
  }
  DStack_210.m_device = (VkDevice)renderPassCreateInfo._16_8_;
  DStack_210.m_allocator = (VkAllocationCallbacks *)renderPassCreateInfo.pAttachments;
  colorAttRef.attachment = renderPassCreateInfo.sType;
  colorAttRef.layout = renderPassCreateInfo._4_4_;
  DStack_210.m_deviceIface = (DeviceInterface *)renderPassCreateInfo.pNext;
  obj_02.m_internal._4_4_ = attachments[0].format;
  obj_02.m_internal._0_4_ = attachments[0].flags;
  if (obj_02.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)8>_> *)&attachments[0].samples,obj_02);
  }
  pAVar4 = env.super_CommandBufferBareTestEnvironment<1U>.m_allocator;
  ::vk::getBufferMemoryRequirements
            ((VkMemoryRequirements *)&renderPassCreateInfo,
             env.super_CommandBufferBareTestEnvironment<1U>.m_vkd,
             env.super_CommandBufferBareTestEnvironment<1U>.m_device,(VkBuffer)colorAttRef);
  (*pAVar4->_vptr_Allocator[3])(attachments,pAVar4,&renderPassCreateInfo,1);
  plVar2 = (long *)CONCAT44(attachments[0].format,attachments[0].flags);
  VVar7 = (*(env.super_CommandBufferBareTestEnvironment<1U>.m_vkd)->_vptr_DeviceInterface[0xc])
                    (env.super_CommandBufferBareTestEnvironment<1U>.m_vkd,
                     env.super_CommandBufferBareTestEnvironment<1U>.m_device,colorAttRef,plVar2[1],
                     plVar2[2]);
  ::vk::checkResult(VVar7,
                    "m_vkd.bindBufferMemory(m_device, *buffer, bufferAlloc->getMemory(), bufferAlloc->getOffset())"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                    ,0x19e);
  pixelBufferAccess.super_ConstPixelBufferAccess.m_format.order = 0x2d;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_size.m_data[0] = 0;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_size.m_data[1] = 0;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_size.m_data[2] = 0x100;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_pitch.m_data[0] = 0x800;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_pitch.m_data[1] = 2;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_pitch.m_data[2] = 6;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_data._0_4_ = 0xffffffff;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_data._4_4_ = 0xffffffff;
  renderPassCreateInfo.sType = VK_STRUCTURE_TYPE_BUFFER_MEMORY_BARRIER;
  renderPassCreateInfo.pNext = (void *)0x0;
  renderPassCreateInfo.flags = 0x1000;
  renderPassCreateInfo.attachmentCount = 0x2000;
  renderPassCreateInfo.pAttachments = (VkAttachmentDescription *)0xffffffffffffffff;
  renderPassCreateInfo.subpassCount = colorAttRef.attachment;
  renderPassCreateInfo._36_4_ = colorAttRef.layout;
  renderPassCreateInfo.pSubpasses = (VkSubpassDescription *)0x0;
  stack0xfffffffffffffd68 = 0;
  attachments[0].storeOp = VK_ATTACHMENT_STORE_OP_DONT_CARE;
  attachments[0].stencilLoadOp = VK_ATTACHMENT_LOAD_OP_LOAD;
  attachments[0].stencilStoreOp = VK_ATTACHMENT_STORE_OP_STORE;
  attachments[0].initialLayout = VK_IMAGE_LAYOUT_GENERAL;
  attachments[0].flags = 0;
  attachments[0].format = VK_FORMAT_UNDEFINED;
  attachments[0].samples = 0xff;
  attachments[0].loadOp = 0xff;
  attachmentViews[0].m_internal = (VkImageView)0x2a;
  renderPassCreateInfo._48_8_ = size;
  VVar7 = (*(env.super_CommandBufferBareTestEnvironment<1U>.m_vkd)->_vptr_DeviceInterface[0x49])
                    (env.super_CommandBufferBareTestEnvironment<1U>.m_vkd,
                     env.super_CommandBufferBareTestEnvironment<1U>.m_primaryCommandBuffers[0]);
  ::vk::checkResult(VVar7,
                    "m_vkd.beginCommandBuffer(m_primaryCommandBuffers[0], &commandBufferBeginInfo)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                    ,0x151);
  (*(env.super_CommandBufferBareTestEnvironment<1U>.m_vkd)->_vptr_DeviceInterface[0x6d])
            (env.super_CommandBufferBareTestEnvironment<1U>.m_vkd,
             env.super_CommandBufferBareTestEnvironment<1U>.m_primaryCommandBuffers[0],0x400,0x1000,
             0,0,0,0,0,1,(VkBufferCreateInfo *)&pixelBufferAccess);
  (*(env.super_CommandBufferBareTestEnvironment<1U>.m_vkd)->_vptr_DeviceInterface[99])
            (env.super_CommandBufferBareTestEnvironment<1U>.m_vkd,
             env.super_CommandBufferBareTestEnvironment<1U>.m_primaryCommandBuffers[0],
             env.m_colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal
             ,6,colorAttRef,1,attachments);
  (*(env.super_CommandBufferBareTestEnvironment<1U>.m_vkd)->_vptr_DeviceInterface[0x6d])
            (env.super_CommandBufferBareTestEnvironment<1U>.m_vkd,
             env.super_CommandBufferBareTestEnvironment<1U>.m_primaryCommandBuffers[0],0x1000,1,0,0,
             0,1,&renderPassCreateInfo,0,0);
  VVar7 = (*(env.super_CommandBufferBareTestEnvironment<1U>.m_vkd)->_vptr_DeviceInterface[0x4a])
                    (env.super_CommandBufferBareTestEnvironment<1U>.m_vkd,
                     env.super_CommandBufferBareTestEnvironment<1U>.m_primaryCommandBuffers[0]);
  ::vk::checkResult(VVar7,"m_vkd.endCommandBuffer(m_primaryCommandBuffers[0])",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                    ,0x1d4);
  CommandBufferRenderPassTestEnvironment::submitPrimaryCommandBuffer(&env);
  ::vk::invalidateMappedMemoryRange
            (env.super_CommandBufferBareTestEnvironment<1U>.m_vkd,
             env.super_CommandBufferBareTestEnvironment<1U>.m_device,(VkDeviceMemory)plVar2[1],
             plVar2[2],size);
  tcu::PixelBufferAccess::PixelBufferAccess((PixelBufferAccess *)attachmentViews,this);
  local_38 = this->m_format;
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            ((ConstPixelBufferAccess *)local_d8,&local_38,&this->m_size,(void *)plVar2[3]);
  tcu::copy((EVP_PKEY_CTX *)attachmentViews,(EVP_PKEY_CTX *)local_d8);
  if (plVar2 != (long *)0x0) {
    (**(code **)(*plVar2 + 8))(plVar2);
  }
  if (colorAttRef != (VkAttachmentReference)0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&DStack_210,(VkBuffer)colorAttRef);
  }
  tcu::TextureLevel::getAccess
            (&pixelBufferAccess,
             result.super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>.
             m_data.ptr);
  pTVar6 = local_a8;
  pbVar10 = (byte *)CONCAT44(pixelBufferAccess.super_ConstPixelBufferAccess.m_data._4_4_,
                             pixelBufferAccess.super_ConstPixelBufferAccess.m_data._0_4_);
  lVar11 = 0;
  do {
    lVar12 = 0;
    pbVar13 = pbVar10;
    do {
      if (*(uint *)((long)&DAT_00b02990 + lVar12) != (uint)*pbVar13) {
        renderPassCreateInfo._0_8_ = &renderPassCreateInfo.flags;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&renderPassCreateInfo,"clear value mismatch","");
        pTVar6->m_code = QP_TEST_RESULT_FAIL;
        (pTVar6->m_description)._M_dataplus._M_p = (pointer)&(pTVar6->m_description).field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&pTVar6->m_description,renderPassCreateInfo._0_8_,
                   (long)renderPassCreateInfo.pNext + renderPassCreateInfo._0_8_);
        goto LAB_00458ee0;
      }
      pbVar13 = pbVar13 + 1;
      lVar12 = lVar12 + 4;
    } while (lVar12 != 0x10);
    lVar11 = lVar11 + 1;
    pbVar10 = pbVar10 + 4;
  } while (lVar11 != 0xfe01);
  renderPassCreateInfo._0_8_ = &renderPassCreateInfo.flags;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&renderPassCreateInfo,"render pass continue test passed","");
  pTVar6->m_code = QP_TEST_RESULT_PASS;
  (pTVar6->m_description)._M_dataplus._M_p = (pointer)&(pTVar6->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pTVar6->m_description,renderPassCreateInfo._0_8_,
             (long)renderPassCreateInfo.pNext + renderPassCreateInfo._0_8_);
LAB_00458ee0:
  if ((VkRenderPassCreateFlags *)renderPassCreateInfo._0_8_ != &renderPassCreateInfo.flags) {
    operator_delete((void *)renderPassCreateInfo._0_8_,renderPassCreateInfo._16_8_ + 1);
  }
  de::details::UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>::reset
            (&result.super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>);
  CommandBufferRenderPassTestEnvironment::~CommandBufferRenderPassTestEnvironment(&env);
  return pTVar6;
}

Assistant:

tcu::TestStatus renderPassContinueTest(Context& context)
{
	const DeviceInterface&					vkd						= context.getDeviceInterface();
	CommandBufferRenderPassTestEnvironment	env						(context, VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT);

	VkCommandBuffer							primaryCommandBuffer	= env.getPrimaryCommandBuffer();
	VkCommandBuffer							secondaryCommandBuffer	= env.getSecondaryCommandBuffer();
	const deUint32							clearColor[4]			= { 2, 47, 131, 211 };

	const VkClearAttachment					clearAttachment			=
	{
		VK_IMAGE_ASPECT_COLOR_BIT,									// VkImageAspectFlags	aspectMask;
		0,															// deUint32				colorAttachment;
		makeClearValueColorU32(clearColor[0],
							   clearColor[1],
							   clearColor[2],
							   clearColor[3])						// VkClearValue			clearValue;
	};

	const VkClearRect						clearRect				=
	{
		CommandBufferRenderPassTestEnvironment::DEFAULT_IMAGE_AREA,	// VkRect2D	rect;
		0u,															// deUint32	baseArrayLayer;
		1u															// deUint32	layerCount;
	};

	env.beginSecondaryCommandBuffer(VK_COMMAND_BUFFER_USAGE_RENDER_PASS_CONTINUE_BIT);
	vkd.cmdClearAttachments(secondaryCommandBuffer, 1, &clearAttachment, 1, &clearRect);
	VK_CHECK(vkd.endCommandBuffer(secondaryCommandBuffer));


	env.beginPrimaryCommandBuffer(0);
	env.beginRenderPass(VK_SUBPASS_CONTENTS_SECONDARY_COMMAND_BUFFERS);
	vkd.cmdExecuteCommands(primaryCommandBuffer, 1, &secondaryCommandBuffer);
	vkd.cmdEndRenderPass(primaryCommandBuffer);

	VK_CHECK(vkd.endCommandBuffer(primaryCommandBuffer));

	env.submitPrimaryCommandBuffer();

	de::MovePtr<tcu::TextureLevel>			result					= env.readColorAttachment();
	tcu::PixelBufferAccess					pixelBufferAccess		= result->getAccess();

	for (deUint32 i = 0; i < (CommandBufferRenderPassTestEnvironment::DEFAULT_IMAGE_SIZE.width * CommandBufferRenderPassTestEnvironment::DEFAULT_IMAGE_SIZE.height); ++i)
	{
		deUint8* colorData = reinterpret_cast<deUint8*>(pixelBufferAccess.getDataPtr());
		for (int colorComponent = 0; colorComponent < 4; ++colorComponent)
			if (colorData[i * 4 + colorComponent] != clearColor[colorComponent])
				return tcu::TestStatus::fail("clear value mismatch");
	}

	return tcu::TestStatus::pass("render pass continue test passed");
}